

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateDestroyAmountRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::CreateDestroyAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  CreateDestroyAmountRequestStruct request;
  RawTransactionResponseStruct response;
  RawTransactionResponse res;
  CreateDestroyAmountRequest req;
  string local_458;
  CreateDestroyAmountRequestStruct local_438;
  RawTransactionResponseStruct local_300;
  ErrorResponse local_238;
  CreateDestroyAmountRequest local_180;
  
  CreateDestroyAmountRequest::CreateDestroyAmountRequest(&local_180);
  core::JsonClassBase<cfd::js::api::json::CreateDestroyAmountRequest>::Deserialize
            (&local_180.super_JsonClassBase<cfd::js::api::json::CreateDestroyAmountRequest>,
             (string *)this);
  CreateDestroyAmountRequest::ConvertToStruct(&local_438,&local_180);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_300,request_message,&local_438);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_300.error.code == 0) {
      RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)&local_238);
      RawTransactionResponse::ConvertFromStruct((RawTransactionResponse *)&local_238,&local_300);
      core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_
                (&local_458,(JsonClassBase<cfd::js::api::json::RawTransactionResponse> *)&local_238)
      ;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)&local_238);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_238,&local_300.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_458,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_238);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      local_238.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a85a68;
      InnerErrorResponse::~InnerErrorResponse(&local_238.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_238.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_300.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_300.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300.error.message._M_dataplus._M_p != &local_300.error.message.field_2) {
      operator_delete(local_300.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300.error.type._M_dataplus._M_p != &local_300.error.type.field_2) {
      operator_delete(local_300.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300.hex._M_dataplus._M_p != &local_300.hex.field_2) {
      operator_delete(local_300.hex._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_438.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_438.fee.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438.fee.asset._M_dataplus._M_p != &local_438.fee.asset.field_2) {
      operator_delete(local_438.fee.asset._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_438.destroy.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438.destroy.direct_nonce._M_dataplus._M_p !=
        &local_438.destroy.direct_nonce.field_2) {
      operator_delete(local_438.destroy.direct_nonce._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438.destroy.asset._M_dataplus._M_p != &local_438.destroy.asset.field_2) {
      operator_delete(local_438.destroy.asset._M_dataplus._M_p);
    }
    std::
    vector<cfd::js::api::ElementsTxOutStruct,_std::allocator<cfd::js::api::ElementsTxOutStruct>_>::
    ~vector(&local_438.txouts);
    std::vector<cfd::js::api::TxInRequestStruct,_std::allocator<cfd::js::api::TxInRequestStruct>_>::
    ~vector(&local_438.txins);
    CreateDestroyAmountRequest::~CreateDestroyAmountRequest(&local_180);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)&local_238);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_300);
  CreateDestroyAmountRequestStruct::~CreateDestroyAmountRequestStruct(&local_438);
  CreateDestroyAmountRequest::~CreateDestroyAmountRequest(&local_180);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}